

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utImporter.cpp
# Opt level: O0

void __thiscall
ImporterTest_testStringProperty_Test::TestBody(ImporterTest_testStringProperty_Test *this)

{
  Importer *pIVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_168;
  Message local_160;
  allocator local_151;
  string local_150;
  string local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  Message local_f8;
  allocator local_e9;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_78;
  Message local_70;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  allocator local_39;
  string local_38;
  undefined1 local_11;
  ImporterTest_testStringProperty_Test *pIStack_10;
  bool b;
  ImporterTest_testStringProperty_Test *this_local;
  
  pIVar1 = (this->super_ImporterTest).pImp;
  pIStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"test",&local_39);
  bVar2 = Assimp::Importer::SetPropertyString(pIVar1,"quakquak",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_61 = (bool)(~bVar2 & 1);
  local_11 = bVar2;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_60,(AssertionResult *)"!b","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utImporter.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  pIVar1 = (this->super_ImporterTest).pImp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"weghwekg",&local_e9);
  Assimp::Importer::GetPropertyString(&local_c8,pIVar1,"quakquak",&local_e8);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_a8,"\"test\"",
             "pImp->GetPropertyString(\"quakquak\",\"weghwekg\")",(char (*) [5])0xc52b9d,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utImporter.cpp"
               ,0xc9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pIVar1 = (this->super_ImporterTest).pImp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"ILoveYou",&local_151);
  Assimp::Importer::GetPropertyString(&local_130,pIVar1,"not_there",&local_150);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_110,"\"ILoveYou\"",
             "pImp->GetPropertyString(\"not_there\",\"ILoveYou\")",(char (*) [9])"ILoveYou",
             &local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utImporter.cpp"
               ,0xca,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  return;
}

Assistant:

TEST_F(ImporterTest, testStringProperty)
{
    bool b = pImp->SetPropertyString("quakquak","test");
    EXPECT_TRUE(!b);
    EXPECT_EQ("test", pImp->GetPropertyString("quakquak","weghwekg"));
    EXPECT_EQ("ILoveYou", pImp->GetPropertyString("not_there","ILoveYou"));
}